

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O2

SBuf * lj_buf_puttab(SBuf *sb,GCtab *t,GCstr *sep,int32_t i,int32_t e)

{
  uint uVar1;
  lua_Number n;
  uint sz;
  long lVar2;
  SBuf *sb_00;
  SBuf *pSVar3;
  long lVar4;
  ulong uVar5;
  cTValue *pcVar6;
  long lVar7;
  char *pcVar8;
  bool bVar9;
  size_t local_60;
  
  if (sep == (GCstr *)0x0) {
    local_60 = 0;
  }
  else {
    local_60 = (size_t)sep->len;
  }
  pSVar3 = sb;
  if (i <= e) {
    lVar2 = (long)i;
    lVar7 = lVar2 << 0x20;
    lVar4 = e - lVar2;
    lVar2 = lVar2 << 3;
    while( true ) {
      if ((uint)i < t->asize) {
        pcVar6 = (cTValue *)((t->array).ptr64 + lVar2);
      }
      else {
        pcVar6 = lj_tab_getinth(t,i);
      }
      if (pcVar6 == (cTValue *)0x0) break;
      n = pcVar6->n;
      sz = (uint)local_60;
      if ((long)n >> 0x2f == 0xfffffffffffffffb) {
        uVar5 = (ulong)n & 0x7fffffffffff;
        uVar1 = *(uint *)(uVar5 + 0x14);
        pcVar8 = sb->w;
        if ((uint)(*(int *)&sb->e - (int)pcVar8) < sz + uVar1) {
          pcVar8 = lj_buf_more2(sb,sz + uVar1);
          uVar5 = pcVar6->u64 & 0x7fffffffffff;
        }
        memcpy(pcVar8,(void *)(uVar5 + 0x18),(ulong)uVar1);
        pcVar8 = pcVar8 + uVar1;
      }
      else {
        if (0xfffffffffffffff1 < (ulong)((long)n >> 0x2f)) break;
        sb_00 = lj_strfmt_putfnum(sb,0xf000035,n);
        pcVar8 = sb_00->w;
        if ((uint)(*(int *)&sb_00->e - (int)pcVar8) < sz) {
          pcVar8 = lj_buf_more2(sb_00,sz);
        }
      }
      bVar9 = lVar4 == 0;
      lVar4 = lVar4 + -1;
      if (bVar9) goto LAB_001254d2;
      if (sz != 0) {
        memcpy(pcVar8,sep + 1,local_60);
        pcVar8 = pcVar8 + local_60;
      }
      sb->w = pcVar8;
      lVar7 = lVar7 + 0x100000000;
      lVar2 = lVar2 + 8;
      i = i + 1;
    }
    pcVar8 = (char *)(lVar7 >> 0x20);
    pSVar3 = (SBuf *)0x0;
LAB_001254d2:
    sb->w = pcVar8;
  }
  return pSVar3;
}

Assistant:

SBuf *lj_buf_puttab(SBuf *sb, GCtab *t, GCstr *sep, int32_t i, int32_t e)
{
  MSize seplen = sep ? sep->len : 0;
  if (i <= e) {
    for (;;) {
      cTValue *o = lj_tab_getint(t, i);
      char *w;
      if (!o) {
      badtype:  /* Error: bad element type. */
	sb->w = (char *)(intptr_t)i;  /* Store failing index. */
	return NULL;
      } else if (tvisstr(o)) {
	MSize len = strV(o)->len;
	w = lj_buf_wmem(lj_buf_more(sb, len + seplen), strVdata(o), len);
      } else if (tvisint(o)) {
	w = lj_strfmt_wint(lj_buf_more(sb, STRFMT_MAXBUF_INT+seplen), intV(o));
      } else if (tvisnum(o)) {
	w = lj_buf_more(lj_strfmt_putfnum(sb, STRFMT_G14, numV(o)), seplen);
      } else {
	goto badtype;
      }
      if (i++ == e) {
	sb->w = w;
	break;
      }
      if (seplen) w = lj_buf_wmem(w, strdata(sep), seplen);
      sb->w = w;
    }
  }
  return sb;
}